

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O3

int gc_printobj(lua_State *L)

{
  uint uVar1;
  StkId pTVar2;
  global_State *pgVar3;
  
  luaL_checkany(L,1);
  pTVar2 = L->ci->func;
  if ((short)pTVar2[1].tt_ < 0) {
    pgVar3 = L->l_G;
    uVar1._0_1_ = pgVar3->currentwhite;
    uVar1._1_1_ = pgVar3->gcstate;
    uVar1._2_1_ = pgVar3->gckind;
    uVar1._3_1_ = pgVar3->gcstopem;
    printobj((global_State *)(ulong)uVar1,pTVar2[1].value_.gc);
    putchar(10);
  }
  else {
    puts("no collectable");
  }
  return 0;
}

Assistant:

static int gc_printobj (lua_State *L) {
  TValue *o;
  luaL_checkany(L, 1);
  o = obj_at(L, 1);
  if (!iscollectable(o))
    printf("no collectable\n");
  else {
    GCObject *obj = gcvalue(o);
    printobj(G(L), obj);
    printf("\n");
  }
  return 0;
}